

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall icu_63::RBBITableBuilder::calcFirstPos(RBBITableBuilder *this,RBBINode *n)

{
  NodeType NVar1;
  RBBINode *pRVar2;
  
  if (n == (RBBINode *)0x0) {
    return;
  }
  if (3 < n->fType - leafChar) {
    calcFirstPos(this,n->fLeftChild);
    calcFirstPos(this,n->fRightChild);
    NVar1 = n->fType;
    if (NVar1 - opStar < 3) {
      pRVar2 = n->fLeftChild;
    }
    else {
      if (NVar1 == opCat) {
        setAdd(this,n->fFirstPosSet,n->fLeftChild->fFirstPosSet);
        if (n->fLeftChild->fNullable == '\0') {
          return;
        }
      }
      else {
        if (NVar1 != opOr) {
          return;
        }
        setAdd(this,n->fFirstPosSet,n->fLeftChild->fFirstPosSet);
      }
      pRVar2 = n->fRightChild;
    }
    setAdd(this,n->fFirstPosSet,pRVar2->fFirstPosSet);
    return;
  }
  UVector::addElement(n->fFirstPosSet,n,this->fStatus);
  return;
}

Assistant:

void RBBITableBuilder::calcFirstPos(RBBINode *n) {
    if (n == NULL) {
        return;
    }
    if (n->fType == RBBINode::leafChar  ||
        n->fType == RBBINode::endMark   ||
        n->fType == RBBINode::lookAhead ||
        n->fType == RBBINode::tag) {
        // These are non-empty leaf node types.
        // Note: In order to maintain the sort invariant on the set,
        // this function should only be called on a node whose set is
        // empty to start with.
        n->fFirstPosSet->addElement(n, *fStatus);
        return;
    }

    // The node is not a leaf.
    //  Calculate firstPos on its children.
    calcFirstPos(n->fLeftChild);
    calcFirstPos(n->fRightChild);

    // Apply functions from table 3.40 in Aho
    if (n->fType == RBBINode::opOr) {
        setAdd(n->fFirstPosSet, n->fLeftChild->fFirstPosSet);
        setAdd(n->fFirstPosSet, n->fRightChild->fFirstPosSet);
    }
    else if (n->fType == RBBINode::opCat) {
        setAdd(n->fFirstPosSet, n->fLeftChild->fFirstPosSet);
        if (n->fLeftChild->fNullable) {
            setAdd(n->fFirstPosSet, n->fRightChild->fFirstPosSet);
        }
    }
    else if (n->fType == RBBINode::opStar ||
             n->fType == RBBINode::opQuestion ||
             n->fType == RBBINode::opPlus) {
        setAdd(n->fFirstPosSet, n->fLeftChild->fFirstPosSet);
    }
}